

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_set_ghosts(Integer g_a,Integer *width)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  Integer ga_handle;
  Integer i;
  Integer in_stack_00000178;
  char *in_stack_00000180;
  long local_18;
  
  lVar1 = in_RDI + 1000;
  if (GA[lVar1].actv == 1) {
    pnga_error(in_stack_00000180,in_stack_00000178);
  }
  if (GA[lVar1].ndim < 1) {
    pnga_error(in_stack_00000180,in_stack_00000178);
  }
  for (local_18 = 0; local_18 < GA[lVar1].ndim; local_18 = local_18 + 1) {
    if (GA[lVar1].dims[local_18] < *(long *)(in_RSI + local_18 * 8)) {
      pnga_error(in_stack_00000180,in_stack_00000178);
    }
    if (*(long *)(in_RSI + local_18 * 8) < 0) {
      pnga_error(in_stack_00000180,in_stack_00000178);
    }
  }
  for (local_18 = 0; local_18 < GA[lVar1].ndim; local_18 = local_18 + 1) {
    GA[lVar1].width[local_18] = *(C_Integer *)(in_RSI + local_18 * 8);
    if (0 < *(long *)(in_RSI + local_18 * 8)) {
      GA[lVar1].ghosts = 1;
    }
  }
  return;
}

Assistant:

void pnga_set_ghosts(Integer g_a, Integer *width)
{
  Integer i;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set ghost widths on array that has been allocated",0);
  if (GA[ga_handle].ndim < 1)
    pnga_error("Dimensions must be set before array widths are specified",0);
  for (i=0; i<GA[ga_handle].ndim; i++) {
    if ((C_Integer)width[i] > GA[ga_handle].dims[i])
      pnga_error("Boundary width must be <= corresponding dimension",i);
    if ((C_Integer)width[i] < 0)
      pnga_error("Boundary width must be >= 0",i);
  }
  for (i=0; i<GA[ga_handle].ndim; i++) {
    GA[ga_handle].width[i] = (C_Integer)width[i];
    if (width[i] > 0) GA[ga_handle].ghosts = 1;
  }
}